

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,true>
               (unsigned_long *ldata,unsigned_long *rdata,unsigned_long *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  unsigned_long rentry_1;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long rentry;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar5 = *rdata;
      iVar4 = 0;
      do {
        result_data[iVar4] = ldata[iVar4] ^ uVar5;
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar2 = puVar1[uVar7];
      uVar3 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar3 = count;
      }
      uVar6 = uVar3;
      if (uVar2 != 0) {
        uVar6 = uVar5;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar5 < uVar3) {
            uVar5 = *rdata;
            do {
              result_data[uVar6] = ldata[uVar6] ^ uVar5;
              uVar6 = uVar6 + 1;
            } while (uVar3 != uVar6);
          }
        }
        else if (uVar5 < uVar3) {
          uVar6 = 0;
          do {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              result_data[uVar5 + uVar6] = *rdata ^ ldata[uVar5 + uVar6];
            }
            uVar6 = uVar6 + 1;
          } while ((uVar5 - uVar3) + uVar6 != 0);
          uVar6 = uVar5 + uVar6;
        }
      }
      uVar7 = uVar7 + 1;
      uVar5 = uVar6;
    } while (uVar7 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}